

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransform2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  TransformNode *pTVar1;
  GroupNode *this_00;
  long *in_RDX;
  ulong uVar2;
  XMLLoader *this_01;
  _Alloc_hider local_c8;
  XMLLoader *local_c0;
  AffineSpace3fa space1;
  AffineSpace3fa space0;
  
  this_01 = (XMLLoader *)xml;
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (&space0,(XMLLoader *)xml,*(Ref<embree::XML> **)(*in_RDX + 0x80));
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (&space1,this_01,(Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + 8));
  if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) == 0x18) {
    pTVar1 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
    loadNode((XMLLoader *)&local_c8,xml);
    SceneGraph::TransformNode::TransformNode
              (pTVar1,&space0,&space1,(Ref<embree::SceneGraph::Node> *)&local_c8);
    (this->path).filename._M_dataplus._M_p = (pointer)pTVar1;
    (**(code **)((long)(pTVar1->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar1);
    if ((long *)local_c8._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_p + 0x18))();
    }
  }
  else {
    local_c0 = this;
    this_00 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,0);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    for (uVar2 = 2; uVar2 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3);
        uVar2 = uVar2 + 1) {
      loadNode((XMLLoader *)&local_c8,xml);
      SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)&local_c8);
      if ((long *)local_c8._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_c8._M_p + 0x18))();
      }
    }
    pTVar1 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
    local_c8._M_p = (pointer)this_00;
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    this = local_c0;
    SceneGraph::TransformNode::TransformNode
              (pTVar1,&space0,&space1,(Ref<embree::SceneGraph::Node> *)&local_c8);
    (this->path).filename._M_dataplus._M_p = (pointer)pTVar1;
    (**(code **)((long)(pTVar1->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar1);
    if ((GroupNode *)local_c8._M_p != (GroupNode *)0x0) {
      (**(code **)(*(long *)local_c8._M_p + 0x18))();
    }
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransform2Node(const Ref<XML>& xml) 
  {
    AffineSpace3fa space0 = load<AffineSpace3fa>(xml->children[0]);
    AffineSpace3fa space1 = load<AffineSpace3fa>(xml->children[1]);

    if (xml->size() == 3)
      return new SceneGraph::TransformNode(space0,space1,loadNode(xml->children[2]));
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=2; i<xml->size(); i++) 
      group->add(loadNode(xml->children[i]));

    return new SceneGraph::TransformNode(space0,space1,group.cast<SceneGraph::Node>());
  }